

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

bool InitHTTPServer(SignalInterrupt *interrupt)

{
  unsigned_short *fmt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  DNSLookupFn dns_lookup_function_01;
  pointer pCVar2;
  pointer ppeVar3;
  pointer ppeVar4;
  raii_evhttp rVar5;
  bool bVar6;
  int iVar7;
  __uniq_ptr_data<event_base,_event_base_deleter,_true,_true> __dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  Logger *pLVar9;
  _Head_base<0UL,_evhttp_*,_false> args_1;
  ulong uVar10;
  CBaseChainParams *pCVar11;
  int64_t iVar12;
  int64_t iVar13;
  WorkQueue<HTTPClosure> *this;
  runtime_error *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  pointer this_01;
  pointer pcVar15;
  bilingual_str *fmt_00;
  undefined8 uVar16;
  pointer name;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view logging_function;
  string_view in;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  char *pcVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  bilingual_str *local_188;
  uint16_t port;
  undefined6 uStack_176;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  endpoints;
  uint16_t http_port;
  raii_evhttp http_ctr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  raii_event_base base_ctr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  string local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  string strAllowed;
  char local_90;
  undefined7 uStack_8f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  int workQueueDepth;
  undefined4 uStack_6c;
  undefined8 local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CSubNet,_std::allocator<CSubNet>_>::_M_erase_at_end
            (&rpc_allow_subnets,
             rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
             super__Vector_impl_data._M_start);
  paVar1 = &local_f0.field_2;
  local_f0.field_2._M_allocated_capacity = 0x2e302e302e373231;
  local_f0.field_2._8_2_ = 0x31;
  local_f0._M_string_length = 9;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&endpoints,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffe60;
  dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
       in_stack_fffffffffffffe58;
  dns_lookup_function.super__Function_base._M_manager = (_Manager_type)interrupt;
  dns_lookup_function._M_invoker._0_4_ = in_stack_fffffffffffffe70;
  dns_lookup_function._M_invoker._4_4_ = in_stack_fffffffffffffe74;
  LookupHost((optional<CNetAddr> *)&strAllowed,&local_f0,false,dns_lookup_function);
  if (local_90 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
    goto LAB_0088227b;
  }
  workQueueDepth = 8;
  std::vector<CSubNet,std::allocator<CSubNet>>::emplace_back<CNetAddr,int>
            ((vector<CSubNet,std::allocator<CSubNet>> *)&rpc_allow_subnets,(CNetAddr *)&strAllowed,
             &workQueueDepth);
  if ((local_90 == '\x01') &&
     (local_90 = '\0', 0x10 < (uint)strAllowed.field_2._M_allocated_capacity._0_4_)) {
    free(strAllowed._M_dataplus._M_p);
    strAllowed._M_dataplus._M_p = (pointer)0x0;
  }
  if (endpoints.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)endpoints.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(&endpoints,&endpoints,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_f0.field_2._M_allocated_capacity._0_4_ = 0x313a3a;
  local_f0._M_string_length = 3;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&port,&g_dns_lookup_abi_cxx11_);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port;
  dns_lookup_function_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffe60;
  dns_lookup_function_00.super__Function_base._M_functor._M_unused._M_object =
       in_stack_fffffffffffffe58;
  dns_lookup_function_00.super__Function_base._M_manager = (_Manager_type)interrupt;
  dns_lookup_function_00._M_invoker._0_4_ = in_stack_fffffffffffffe70;
  dns_lookup_function_00._M_invoker._4_4_ = in_stack_fffffffffffffe74;
  LookupHost((optional<CNetAddr> *)&strAllowed,&local_f0,false,dns_lookup_function_00);
  if (local_90 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
    goto LAB_0088227b;
  }
  std::vector<CSubNet,_std::allocator<CSubNet>_>::emplace_back<CNetAddr>
            (&rpc_allow_subnets,(CNetAddr *)&strAllowed);
  if ((local_90 == '\x01') &&
     (local_90 = '\0', 0x10 < (uint)strAllowed.field_2._M_allocated_capacity._0_4_)) {
    free(strAllowed._M_dataplus._M_p);
    strAllowed._M_dataplus._M_p = (pointer)0x0;
  }
  if ((_Manager_type)local_168._M_allocated_capacity != (_Manager_type)0x0) {
    (*(code *)local_168._M_allocated_capacity)(&port,&port,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
  strAllowed.field_2._M_allocated_capacity._4_4_ = 0x6f6c6c61;
  strAllowed.field_2._M_local_buf[8] = 'w';
  strAllowed.field_2._9_2_ = 0x7069;
  strAllowed._M_string_length = 0xb;
  strAllowed.field_2._M_local_buf[0xb] = '\0';
  strAllowed._M_dataplus._M_p = (pointer)&strAllowed.field_2;
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffffe70,&gArgs,&strAllowed);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strAllowed._M_dataplus._M_p != &strAllowed.field_2) {
    operator_delete(strAllowed._M_dataplus._M_p,
                    CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                             strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
  }
  fmt_00 = (bilingual_str *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70);
  uVar10 = (ulong)(fmt_00 == local_188);
  if (fmt_00 != local_188) {
    uVar10 = 0;
    do {
      LookupSubNet((CSubNet *)&workQueueDepth,&fmt_00->original);
      bVar6 = CSubNet::IsValid((CSubNet *)&workQueueDepth);
      if (bVar6) {
        std::vector<CSubNet,_std::allocator<CSubNet>_>::push_back
                  (&rpc_allow_subnets,(CSubNet *)&workQueueDepth);
      }
      else {
        http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
        super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
        _M_head_impl = (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)
                       (__uniq_ptr_impl<evhttp,_evhttp_deleter>)0xa7;
        base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
        super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
        super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
             (__uniq_ptr_data<event_base,_event_base_deleter,_true,_true>)
             (__uniq_ptr_data<event_base,_event_base_deleter,_true,_true>)&local_100;
        __dest.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
        super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
        super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
             (__uniq_ptr_impl<event_base,_event_base_deleter>)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &base_ctr,(size_type *)&http_ctr,0);
        rVar5 = http_ctr;
        local_100._M_allocated_capacity =
             (size_type)
             http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
             super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>
             ._M_head_impl;
        base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
        super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
        super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
             (__uniq_ptr_data<event_base,_event_base_deleter,_true,_true>)
             (__uniq_ptr_data<event_base,_event_base_deleter,_true,_true>)
             __dest.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
             super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
             super__Head_base<0UL,_event_base_*,_false>._M_head_impl;
        memcpy((void *)__dest.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
                       super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
                       super__Head_base<0UL,_event_base_*,_false>._M_head_impl,
               "Invalid -rpcallowip subnet specification: %s. Valid are a single IP (e.g. 1.2.3.4), a network/netmask (e.g. 1.2.3.4/255.255.255.0) or a network/CIDR (e.g. 1.2.3.4/24)."
               ,0xa7);
        *(char *)((long)__dest.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
                        super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
                        super__Head_base<0UL,_event_base_*,_false>._M_head_impl +
                 (long)rVar5._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
                       super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                       super__Head_base<0UL,_evhttp_*,_false>._M_head_impl) = '\0';
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,
                   base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
                   super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
                   super__Head_base<0UL,_event_base_*,_false>._M_head_impl,
                   (long)rVar5._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
                         super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                         super__Head_base<0UL,_evhttp_*,_false>._M_head_impl +
                   (long)base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
                         super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
                         super__Head_base<0UL,_event_base_*,_false>._M_head_impl);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,
                   base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
                   super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
                   super__Head_base<0UL,_event_base_*,_false>._M_head_impl,
                   (long)rVar5._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
                         super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                         super__Head_base<0UL,_evhttp_*,_false>._M_head_impl +
                   (long)base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
                         super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
                         super__Head_base<0UL,_event_base_*,_false>._M_head_impl);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)&strAllowed,(tinyformat *)&local_f0,fmt_00,pbVar8);
        local_120._M_local_buf[0] = '\0';
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10000402;
        http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
        super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
        _M_head_impl = (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)
                       (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)&local_120;
        CClientUIInterface::ThreadSafeMessageBox
                  ((CClientUIInterface *)&uiInterface,(bilingual_str *)&strAllowed,
                   (string *)&http_ctr,0x10000402);
        if (http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
            super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
            _M_head_impl != (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)&local_120) {
          operator_delete((void *)http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
                                  super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.
                                  super__Head_base<0UL,_evhttp_*,_false>._M_head_impl,
                          CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(uStack_8f,local_90) != &local_80) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(uStack_8f,local_90),local_80._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)strAllowed._M_dataplus._M_p != &strAllowed.field_2) {
          operator_delete(strAllowed._M_dataplus._M_p,
                          CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                   strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
            super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
            super__Head_base<0UL,_event_base_*,_false>._M_head_impl !=
            (__uniq_ptr_data<event_base,_event_base_deleter,_true,_true>)&local_100) {
          operator_delete((void *)base_ctr._M_t.
                                  super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
                                  super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
                                  super__Head_base<0UL,_event_base_*,_false>._M_head_impl,
                          (ulong)(local_100._M_allocated_capacity + 1));
        }
      }
      if (0x10 < (uint)local_60[0]._0_4_) {
        free((void *)_workQueueDepth);
        _workQueueDepth =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
      }
      if (!bVar6) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xfffffffffffffe70);
        if ((uVar10 & 1) != 0) goto LAB_008811cb;
        goto LAB_00881388;
      }
      fmt_00 = (bilingual_str *)&fmt_00->translated;
      uVar10 = (ulong)(fmt_00 == local_188);
    } while (fmt_00 != local_188);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe70);
LAB_008811cb:
  pCVar2 = rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
           super__Vector_impl_data._M_finish;
  strAllowed._M_dataplus._M_p = (pointer)&strAllowed.field_2;
  strAllowed._M_string_length = 0;
  strAllowed.field_2._M_allocated_capacity._0_4_ =
       strAllowed.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  if (rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
      super__Vector_impl_data._M_start !=
      rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_01 = rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      CSubNet::ToString_abi_cxx11_((string *)&workQueueDepth,this_01);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((string *)&workQueueDepth," ");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar8->_M_dataplus)._M_p;
      paVar14 = &pbVar8->field_2;
      if (paVar1 == paVar14) {
        local_f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_f0.field_2._8_8_ = *(ulong *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_f0._M_dataplus._M_p = (pointer)paVar1;
      }
      local_f0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&strAllowed,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_workQueueDepth != local_60) {
        operator_delete((void *)_workQueueDepth,
                        CONCAT44(local_60[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_60[0]._M_allocated_capacity) + 1);
      }
      this_01 = this_01 + 1;
    } while (this_01 != pCVar2);
  }
  pLVar9 = LogInstance();
  pcVar17 = (char *)0x88130e;
  bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar9,HTTP,Debug);
  if (bVar6) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "InitHTTPAllowList";
    logging_function._M_len = 0x11;
    LogPrintf_<std::__cxx11::string>
              (logging_function,source_file,0xee,
               IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|REINDEX|SELECTCOINS|
               ADDRMAN|ESTIMATEFEE|WALLETDB|BENCH,(Level)&strAllowed,pcVar17,
               in_stack_fffffffffffffe58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strAllowed._M_dataplus._M_p != &strAllowed.field_2) {
    operator_delete(strAllowed._M_dataplus._M_p,
                    CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                             strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
  }
LAB_00881388:
  if ((uVar10 & 1) == 0) {
    bVar6 = false;
  }
  else {
    event_set_log_callback(libevent_log_cb);
    pLVar9 = LogInstance();
    bVar6 = BCLog::Logger::WillLogCategory(pLVar9,LIBEVENT);
    event_enable_debug_logging(-(uint)bVar6);
    evthread_use_pthreads();
    base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
    super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
    super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
         (__uniq_ptr_data<event_base,_event_base_deleter,_true,_true>)event_base_new();
    if ((tuple<event_base_*,_event_base_deleter>)
        base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
        super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
        super__Head_base<0UL,_event_base_*,_false>._M_head_impl ==
        (_Head_base<0UL,_event_base_*,_false>)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"cannot create event_base");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0088227b;
    }
    args_1._M_head_impl =
         (evhttp *)
         evhttp_new(base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
                    super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
                    super__Head_base<0UL,_event_base_*,_false>._M_head_impl);
    paVar1 = &strAllowed.field_2;
    http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
    super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
    _M_head_impl = (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)
                   (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)args_1._M_head_impl;
    if ((tuple<evhttp_*,_evhttp_deleter>)args_1._M_head_impl ==
        (_Head_base<0UL,_evhttp_*,_false>)0x0) {
      pcVar17 = "couldn\'t create evhttp. Exiting.\n";
      iVar7 = 0x1c7;
LAB_00881c43:
      source_file_08._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
      ;
      source_file_08._M_len = 0x57;
      logging_function_08._M_str = "InitHTTPServer";
      logging_function_08._M_len = 0xe;
      LogPrintf_<>(logging_function_08,source_file_08,iVar7,ALL,Info,pcVar17);
      bVar6 = false;
    }
    else {
      strAllowed._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&strAllowed,"-rpcservertimeout","");
      uVar10 = ArgsManager::GetIntArg(&gArgs,&strAllowed,0x1e);
      evhttp_set_timeout(args_1._M_head_impl,uVar10 & 0xffffffff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)strAllowed._M_dataplus._M_p != paVar1) {
        operator_delete(strAllowed._M_dataplus._M_p,
                        CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                 strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
      }
      evhttp_set_max_headers_size(args_1._M_head_impl,0x2000);
      evhttp_set_max_body_size(args_1._M_head_impl,0x2000000);
      evhttp_set_gencb(args_1._M_head_impl,http_request_cb,interrupt);
      strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
      strAllowed.field_2._M_allocated_capacity._4_4_ = 0x74726f70;
      strAllowed._M_string_length = 8;
      strAllowed.field_2._M_local_buf[8] = '\0';
      strAllowed._M_dataplus._M_p = (pointer)paVar1;
      pCVar11 = BaseParams();
      iVar12 = ArgsManager::GetIntArg(&gArgs,&strAllowed,(ulong)pCVar11->m_rpc_port);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)strAllowed._M_dataplus._M_p != paVar1) {
        operator_delete(strAllowed._M_dataplus._M_p,
                        CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                 strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
      }
      http_port = (uint16_t)iVar12;
      endpoints.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      endpoints.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      endpoints.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
      strAllowed.field_2._M_allocated_capacity._4_4_ = 0x6f6c6c61;
      strAllowed.field_2._M_local_buf[8] = 'w';
      strAllowed.field_2._9_2_ = 0x7069;
      strAllowed._M_string_length = 0xb;
      strAllowed.field_2._M_local_buf[0xb] = '\0';
      strAllowed._M_dataplus._M_p = (pointer)paVar1;
      bVar6 = ArgsManager::IsArgSet(&gArgs,&strAllowed);
      if (bVar6) {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        local_f0.field_2._M_allocated_capacity = 0x646e69626370722d;
        local_f0._M_string_length = 8;
        local_f0.field_2._8_8_ = local_f0.field_2._8_8_ & 0xffffffffffffff00;
        bVar6 = ArgsManager::IsArgSet(&gArgs,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)strAllowed._M_dataplus._M_p != paVar1) {
        operator_delete(strAllowed._M_dataplus._M_p,
                        CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                 strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar6 == false) {
        std::
        vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
        ::emplace_back<char_const(&)[4],unsigned_short&>
                  ((vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
                    *)&endpoints,(char (*) [4])0xeddd55,&http_port);
        std::
        vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
        ::emplace_back<char_const(&)[10],unsigned_short&>
                  ((vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
                    *)&endpoints,(char (*) [10])0xee10f3,&http_port);
        strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
        strAllowed.field_2._M_allocated_capacity._4_4_ = 0x6f6c6c61;
        strAllowed.field_2._M_local_buf[8] = 'w';
        strAllowed.field_2._9_2_ = 0x7069;
        strAllowed._M_string_length = 0xb;
        strAllowed.field_2._M_local_buf[0xb] = '\0';
        strAllowed._M_dataplus._M_p = (pointer)paVar1;
        bVar6 = ArgsManager::IsArgSet(&gArgs,&strAllowed);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)strAllowed._M_dataplus._M_p != paVar1) {
          operator_delete(strAllowed._M_dataplus._M_p,
                          CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                   strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if (bVar6) {
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
          ;
          source_file_00._M_len = 0x57;
          logging_function_00._M_str = "HTTPBindAddresses";
          logging_function_00._M_len = 0x11;
          LogPrintf_<>(logging_function_00,source_file_00,0x170,ALL,Info,
                       "WARNING: option -rpcallowip was specified without -rpcbind; this doesn\'t usually make sense\n"
                      );
        }
        strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
        strAllowed.field_2._M_allocated_capacity._4_4_ = 0x646e6962;
        strAllowed._M_string_length = 8;
        strAllowed.field_2._M_local_buf[8] = '\0';
        strAllowed._M_dataplus._M_p = (pointer)paVar1;
        bVar6 = ArgsManager::IsArgSet(&gArgs,&strAllowed);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)strAllowed._M_dataplus._M_p != paVar1) {
          operator_delete(strAllowed._M_dataplus._M_p,
                          CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                   strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if (bVar6) {
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
          ;
          source_file_01._M_len = 0x57;
          logging_function_01._M_str = "HTTPBindAddresses";
          logging_function_01._M_len = 0x11;
          LogPrintf_<>(logging_function_01,source_file_01,0x173,ALL,Info,
                       "WARNING: option -rpcbind was ignored because -rpcallowip was not specified, refusing to allow everyone to connect\n"
                      );
        }
      }
      else {
        strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
        strAllowed.field_2._M_allocated_capacity._4_4_ = 0x646e6962;
        strAllowed._M_string_length = 8;
        strAllowed.field_2._M_local_buf[8] = '\0';
        strAllowed._M_dataplus._M_p = (pointer)paVar1;
        bVar6 = ArgsManager::IsArgSet(&gArgs,&strAllowed);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)strAllowed._M_dataplus._M_p != paVar1) {
          operator_delete(strAllowed._M_dataplus._M_p,
                          CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                   strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if (bVar6) {
          strAllowed.field_2._M_allocated_capacity._0_4_ = 0x6370722d;
          strAllowed.field_2._M_allocated_capacity._4_4_ = 0x646e6962;
          strAllowed._M_string_length = 8;
          strAllowed.field_2._M_local_buf[8] = '\0';
          strAllowed._M_dataplus._M_p = (pointer)paVar1;
          ArgsManager::GetArgs
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&workQueueDepth,&gArgs,&strAllowed);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)strAllowed._M_dataplus._M_p != paVar1) {
            operator_delete(strAllowed._M_dataplus._M_p,
                            CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                     strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if (_workQueueDepth != local_68) {
            uVar16 = _workQueueDepth;
            do {
              port = http_port;
              strAllowed._M_dataplus._M_p = (pointer)&strAllowed.field_2;
              strAllowed._M_string_length = 0;
              strAllowed.field_2._M_allocated_capacity._0_4_ =
                   strAllowed.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
              in._M_str = *(char **)uVar16;
              in._M_len = *(size_t *)(uVar16 + 8);
              SplitHostPort(in,&port,&strAllowed);
              std::
              vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
              ::emplace_back<std::__cxx11::string&,unsigned_short&>
                        ((vector<std::pair<std::__cxx11::string,unsigned_short>,std::allocator<std::pair<std::__cxx11::string,unsigned_short>>>
                          *)&endpoints,&strAllowed,&port);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)strAllowed._M_dataplus._M_p != &strAllowed.field_2) {
                operator_delete(strAllowed._M_dataplus._M_p,
                                CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                         strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
              }
              uVar16 = uVar16 + 0x20;
            } while (uVar16 != local_68);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&workQueueDepth);
        }
      }
      if (endpoints.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          endpoints.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        name = endpoints.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        do {
          fmt = &name->second;
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
          ;
          source_file_02._M_len = 0x57;
          logging_function_02._M_str = "HTTPBindAddresses";
          logging_function_02._M_len = 0x11;
          LogPrintf_<std::__cxx11::string,unsigned_short>
                    (logging_function_02,source_file_02,0x180,
                     IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|CMPCTBLOCK|
                     ADDRMAN|WALLETDB|HTTP|MEMPOOL|TOR|NET,(Level)name,(char *)fmt,
                     in_stack_fffffffffffffe58,(unsigned_short *)args_1._M_head_impl);
          if ((name->first)._M_string_length == 0) {
            pcVar15 = (pointer)0x0;
          }
          else {
            pcVar15 = (name->first)._M_dataplus._M_p;
          }
          _port = evhttp_bind_socket_with_handle(args_1._M_head_impl,pcVar15,*fmt);
          if ((evhttp_bound_socket *)_port == (evhttp_bound_socket *)0x0) {
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
            ;
            source_file_05._M_len = 0x57;
            logging_function_05._M_str = "HTTPBindAddresses";
            logging_function_05._M_len = 0x11;
            LogPrintf_<std::__cxx11::string,unsigned_short>
                      (logging_function_05,source_file_05,399,
                       IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|CMPCTBLOCK|
                       ADDRMAN|ESTIMATEFEE|BENCH|HTTP|MEMPOOL|TOR|NET,(Level)name,(char *)fmt,
                       in_stack_fffffffffffffe58,(unsigned_short *)args_1._M_head_impl);
          }
          else {
            std::
            function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
            ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                        *)&workQueueDepth,&g_dns_lookup_abi_cxx11_);
            dns_lookup_function_01.super__Function_base._M_functor._8_8_ = args_1._M_head_impl;
            dns_lookup_function_01.super__Function_base._M_functor._M_unused._M_object =
                 in_stack_fffffffffffffe58;
            dns_lookup_function_01.super__Function_base._M_manager = (_Manager_type)interrupt;
            dns_lookup_function_01._M_invoker._0_4_ = in_stack_fffffffffffffe70;
            dns_lookup_function_01._M_invoker._4_4_ = in_stack_fffffffffffffe74;
            LookupHost((optional<CNetAddr> *)&strAllowed,&name->first,false,dns_lookup_function_01);
            if ((code *)CONCAT44(local_60[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_60[0]._M_allocated_capacity) != (code *)0x0) {
              (*(code *)CONCAT44(local_60[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_60[0]._M_allocated_capacity))
                        ((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                          *)&workQueueDepth,
                         (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                          *)&workQueueDepth,3);
            }
            if (((name->first)._M_string_length == 0) ||
               ((local_90 == '\x01' && (bVar6 = CNetAddr::IsBindAny((CNetAddr *)&strAllowed), bVar6)
                ))) {
              source_file_03._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
              ;
              source_file_03._M_len = 0x57;
              logging_function_03._M_str = "HTTPBindAddresses";
              logging_function_03._M_len = 0x11;
              LogPrintf_<>(logging_function_03,source_file_03,0x185,ALL,Info,
                           "WARNING: the RPC server is not safe to expose to untrusted networks such as the public internet\n"
                          );
            }
            iVar7 = evhttp_bound_socket_get_fd(_port);
            in_stack_fffffffffffffe70 = 1;
            iVar7 = setsockopt(iVar7,6,1,&stack0xfffffffffffffe70,4);
            if (iVar7 == -1) {
              source_file_04._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
              ;
              source_file_04._M_len = 0x57;
              logging_function_04._M_str = "HTTPBindAddresses";
              logging_function_04._M_len = 0x11;
              LogPrintf_<>(logging_function_04,source_file_04,0x18b,ALL,Info,
                           "WARNING: Unable to set TCP_NODELAY on RPC server socket, continuing anyway\n"
                          );
            }
            if (boundSockets.
                super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                boundSockets.
                super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<evhttp_bound_socket*,std::allocator<evhttp_bound_socket*>>::
              _M_realloc_insert<evhttp_bound_socket*const&>
                        ((vector<evhttp_bound_socket*,std::allocator<evhttp_bound_socket*>> *)
                         &boundSockets,
                         (iterator)
                         boundSockets.
                         super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(evhttp_bound_socket **)&port);
            }
            else {
              *boundSockets.
               super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
               _M_impl.super__Vector_impl_data._M_finish = (evhttp_bound_socket *)_port;
              boundSockets.
              super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   boundSockets.
                   super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            if ((local_90 == '\x01') &&
               (local_90 = '\0', 0x10 < (uint)strAllowed.field_2._M_allocated_capacity._0_4_)) {
              free(strAllowed._M_dataplus._M_p);
              strAllowed._M_dataplus._M_p = (pointer)0x0;
            }
          }
          name = name + 1;
        } while (name != endpoints.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      }
      ppeVar4 = boundSockets.
                super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppeVar3 = boundSockets.
                super__Vector_base<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
      ::~vector(&endpoints);
      if (ppeVar3 == ppeVar4) {
        pcVar17 = "Unable to bind any endpoint for RPC server\n";
        iVar7 = 0x1d1;
        goto LAB_00881c43;
      }
      pLVar9 = LogInstance();
      bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar9,HTTP,Debug);
      if (bVar6) {
        source_file_06._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
        ;
        source_file_06._M_len = 0x57;
        logging_function_06._M_str = "InitHTTPServer";
        logging_function_06._M_len = 0xe;
        LogPrintf_<>(logging_function_06,source_file_06,0x1d5,HTTP,Debug,"Initialized HTTP server\n"
                    );
      }
      strAllowed._M_dataplus._M_p = (pointer)&strAllowed.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&strAllowed,"-rpcworkqueue","");
      iVar13 = ArgsManager::GetIntArg(&gArgs,&strAllowed,0x10);
      iVar12 = 1;
      if (1 < iVar13) {
        iVar12 = iVar13;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)strAllowed._M_dataplus._M_p != &strAllowed.field_2) {
        operator_delete(strAllowed._M_dataplus._M_p,
                        CONCAT44(strAllowed.field_2._M_allocated_capacity._4_4_,
                                 strAllowed.field_2._M_allocated_capacity._0_4_) + 1);
      }
      workQueueDepth = (int)iVar12;
      pLVar9 = LogInstance();
      bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar9,HTTP,Debug);
      if (bVar6) {
        source_file_07._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
        ;
        source_file_07._M_len = 0x57;
        logging_function_07._M_str = "InitHTTPServer";
        logging_function_07._M_len = 0xe;
        LogPrintf_<int>(logging_function_07,source_file_07,0x1d7,HTTP,Debug,
                        "creating work queue of depth %d\n",&workQueueDepth);
      }
      this = (WorkQueue<HTTPClosure> *)operator_new(0xb8);
      WorkQueue<HTTPClosure>::WorkQueue(this,(long)workQueueDepth);
      std::__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>::
      reset((__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
             *)&g_work_queue,this);
      eventBase = (event_base *)base_ctr;
      eventHTTP = (evhttp *)http_ctr;
      base_ctr._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
      super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
      super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
           (__uniq_ptr_data<event_base,_event_base_deleter,_true,_true>)
           (__uniq_ptr_impl<event_base,_event_base_deleter>)0x0;
      http_ctr._M_t.super___uniq_ptr_impl<evhttp,_evhttp_deleter>._M_t.
      super__Tuple_impl<0UL,_evhttp_*,_evhttp_deleter>.super__Head_base<0UL,_evhttp_*,_false>.
      _M_head_impl = (__uniq_ptr_data<evhttp,_evhttp_deleter,_true,_true>)
                     (__uniq_ptr_impl<evhttp,_evhttp_deleter>)0x0;
      bVar6 = true;
    }
    std::unique_ptr<evhttp,_evhttp_deleter>::~unique_ptr(&http_ctr);
    std::unique_ptr<event_base,_event_base_deleter>::~unique_ptr(&base_ctr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
LAB_0088227b:
  __stack_chk_fail();
}

Assistant:

bool InitHTTPServer(const util::SignalInterrupt& interrupt)
{
    if (!InitHTTPAllowList())
        return false;

    // Redirect libevent's logging to our own log
    event_set_log_callback(&libevent_log_cb);
    // Update libevent's log handling.
    UpdateHTTPServerLogging(LogInstance().WillLogCategory(BCLog::LIBEVENT));

#ifdef WIN32
    evthread_use_windows_threads();
#else
    evthread_use_pthreads();
#endif

    raii_event_base base_ctr = obtain_event_base();

    /* Create a new evhttp object to handle requests. */
    raii_evhttp http_ctr = obtain_evhttp(base_ctr.get());
    struct evhttp* http = http_ctr.get();
    if (!http) {
        LogPrintf("couldn't create evhttp. Exiting.\n");
        return false;
    }

    evhttp_set_timeout(http, gArgs.GetIntArg("-rpcservertimeout", DEFAULT_HTTP_SERVER_TIMEOUT));
    evhttp_set_max_headers_size(http, MAX_HEADERS_SIZE);
    evhttp_set_max_body_size(http, MAX_SIZE);
    evhttp_set_gencb(http, http_request_cb, (void*)&interrupt);

    if (!HTTPBindAddresses(http)) {
        LogPrintf("Unable to bind any endpoint for RPC server\n");
        return false;
    }

    LogDebug(BCLog::HTTP, "Initialized HTTP server\n");
    int workQueueDepth = std::max((long)gArgs.GetIntArg("-rpcworkqueue", DEFAULT_HTTP_WORKQUEUE), 1L);
    LogDebug(BCLog::HTTP, "creating work queue of depth %d\n", workQueueDepth);

    g_work_queue = std::make_unique<WorkQueue<HTTPClosure>>(workQueueDepth);
    // transfer ownership to eventBase/HTTP via .release()
    eventBase = base_ctr.release();
    eventHTTP = http_ctr.release();
    return true;
}